

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetPreconditionerBS
              (void *cvode_mem,int which,CVLsPrecSetupFnBS psetupBS,CVLsPrecSolveFnBS psolveBS)

{
  int iVar1;
  code *psolve;
  code *psetup;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVLsMemB local_30;
  CVodeBMem local_28;
  CVadjMem local_20;
  CVodeMem local_18;
  
  iVar1 = cvLs_AccessLMemB(cvode_mem,which,"CVodeSetPreconditionerBS",&local_18,&local_20,&local_28,
                           &local_30);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_30->psetBS = psetupBS;
  local_30->psolveBS = psolveBS;
  psetup = cvLsPrecSetupBSWrapper;
  if (psetupBS == (CVLsPrecSetupFnBS)0x0) {
    psetup = (CVLsPrecSetupFn)0x0;
  }
  psolve = cvLsPrecSolveBSWrapper;
  if (psolveBS == (CVLsPrecSolveFnBS)0x0) {
    psolve = (CVLsPrecSolveFn)0x0;
  }
  iVar1 = CVodeSetPreconditioner(local_28->cv_mem,psetup,psolve);
  return iVar1;
}

Assistant:

int CVodeSetPreconditionerBS(void* cvode_mem, int which,
                             CVLsPrecSetupFnBS psetupBS,
                             CVLsPrecSolveFnBS psolveBS)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  CVLsMemB cvlsB_mem;
  CVLsPrecSetupFn cvls_psetup;
  CVLsPrecSolveFn cvls_psolve;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Set preconditioners for the backward problem. */
  cvlsB_mem->psetBS   = psetupBS;
  cvlsB_mem->psolveBS = psolveBS;

  /* Call the corresponding "set" routine for the backward problem */
  cvodeB_mem  = (void*)(cvB_mem->cv_mem);
  cvls_psetup = (psetupBS == NULL) ? NULL : cvLsPrecSetupBSWrapper;
  cvls_psolve = (psolveBS == NULL) ? NULL : cvLsPrecSolveBSWrapper;
  return (CVodeSetPreconditioner(cvodeB_mem, cvls_psetup, cvls_psolve));
}